

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_codecs.cpp
# Opt level: O2

void __thiscall
codecs_hex_codec_errors_Test::codecs_hex_codec_errors_Test(codecs_hex_codec_errors_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00272e40;
  return;
}

Assistant:

TEST(codecs, hex_codec_errors)
{
    EXPECT_THROW(ST::hex_encode(nullptr, 1), std::invalid_argument);

    EXPECT_THROW(ST::hex_decode(ST_LITERAL("1")), ST::codec_error);
    EXPECT_THROW(ST::hex_decode(ST_LITERAL("xF")), ST::codec_error);
    EXPECT_THROW(ST::hex_decode(ST_LITERAL("Fx")), ST::codec_error);
    EXPECT_THROW(ST::hex_decode(ST_LITERAL("\000F")), ST::codec_error);
    EXPECT_THROW(ST::hex_decode(ST_LITERAL("F\000")), ST::codec_error);

    char buffer[64];
    EXPECT_EQ(-1, ST::hex_decode(ST_LITERAL("1"), buffer, sizeof(buffer)));
    EXPECT_EQ(-1, ST::hex_decode(ST_LITERAL("xF"), buffer, sizeof(buffer)));
    EXPECT_EQ(-1, ST::hex_decode(ST_LITERAL("Fx"), buffer, sizeof(buffer)));
    EXPECT_EQ(-1, ST::hex_decode(ST_LITERAL("\000F"), buffer, sizeof(buffer)));
    EXPECT_EQ(-1, ST::hex_decode(ST_LITERAL("F\000"), buffer, sizeof(buffer)));

    char tight_buffer[3];
    EXPECT_EQ(-1, ST::hex_decode(ST_LITERAL("01020304"), tight_buffer, sizeof(tight_buffer)));
}